

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_base.c
# Opt level: O1

int lj_cf_unpack(lua_State *L)

{
  TValue *pTVar1;
  cTValue *pcVar2;
  uint key;
  MSize MVar3;
  int iVar4;
  cTValue *pcVar5;
  int size;
  long lVar6;
  GCtab *t;
  
  pTVar1 = L->base;
  if ((L->top <= pTVar1) || ((pTVar1->field_2).it != 0xfffffff4)) {
    lj_err_argt(L,1,5);
  }
  t = (GCtab *)(ulong)(pTVar1->u32).lo;
  key = 1;
  if ((pTVar1 + 1 < L->top) && (*(int *)((long)pTVar1 + 0xc) != -1)) {
    key = lj_lib_checkint(L,2);
  }
  if ((L->base + 2 < L->top) && (*(int *)((long)L->base + 0x14) != -1)) {
    MVar3 = lj_lib_checkint(L,3);
  }
  else {
    MVar3 = lj_tab_len(t);
  }
  if ((int)key <= (int)MVar3) {
    if (-1 < (int)(MVar3 - key)) {
      size = (MVar3 - key) + 1;
      iVar4 = lua_checkstack(L,size);
      if (iVar4 != 0) {
        lVar6 = (long)(int)key << 3;
        do {
          if (key < t->asize) {
            pcVar5 = (cTValue *)((ulong)(t->array).ptr32 + lVar6);
          }
          else {
            pcVar5 = lj_tab_getinth(t,key);
          }
          pcVar2 = L->top;
          L->top = pcVar2 + 1;
          if (pcVar5 == (cTValue *)0x0) {
            (pcVar2->field_2).it = 0xffffffff;
          }
          else {
            *pcVar2 = *pcVar5;
          }
          key = key + 1;
          lVar6 = lVar6 + 8;
        } while (MVar3 + 1 != key);
        return size;
      }
    }
    lj_err_caller(L,LJ_ERR_UNPACK);
  }
  return 0;
}

Assistant:

LJLIB_CF(unpack)
{
  GCtab *t = lj_lib_checktab(L, 1);
  int32_t n, i = lj_lib_optint(L, 2, 1);
  int32_t e = (L->base+3-1 < L->top && !tvisnil(L->base+3-1)) ?
	      lj_lib_checkint(L, 3) : (int32_t)lj_tab_len(t);
  if (i > e) return 0;
  n = e - i + 1;
  if (n <= 0 || !lua_checkstack(L, n))
    lj_err_caller(L, LJ_ERR_UNPACK);
  do {
    cTValue *tv = lj_tab_getint(t, i);
    if (tv) {
      copyTV(L, L->top++, tv);
    } else {
      setnilV(L->top++);
    }
  } while (i++ < e);
  return n;
}